

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

rcode __thiscall
olc::Renderable::Load(Renderable *this,string *sFile,ResourcePack *pack,bool filter)

{
  Decal *pDVar1;
  rcode rVar2;
  _Head_base<0UL,_olc::Decal_*,_false> _Var3;
  int iVar4;
  bool filter_local;
  _Head_base<0UL,_olc::Decal_*,_false> local_30;
  _Head_base<0UL,_olc::Sprite_*,_false> local_28;
  
  std::make_unique<olc::Sprite>();
  _Var3._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (Decal *)0x0;
  std::__uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>::reset
            ((__uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_> *)this,
             (pointer)_Var3._M_head_impl);
  std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::~unique_ptr
            ((unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_> *)&local_30);
  iVar4 = (**(code **)(*olc::Sprite::loader + 0x10))
                    (olc::Sprite::loader,
                     (this->pSprite)._M_t.
                     super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>._M_t.
                     super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
                     super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl,sFile,pack);
  if (iVar4 == 1) {
    local_28._M_head_impl =
         (this->pSprite)._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>.
         _M_t.super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
         super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl;
    std::make_unique<olc::Decal,olc::Sprite*,bool&>((Sprite **)&local_30,(bool *)&local_28);
    _Var3._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (Decal *)0x0;
    pDVar1 = (this->pDecal)._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>
             ._M_t.super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
             super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl;
    (this->pDecal)._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>._M_t.
    super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
    super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (pDVar1 != (Decal *)0x0) {
      (*pDVar1->_vptr_Decal[1])();
      if (local_30._M_head_impl != (Decal *)0x0) {
        (*(local_30._M_head_impl)->_vptr_Decal[1])();
      }
    }
    rVar2 = OK;
  }
  else {
    (this->pSprite)._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>._M_t.
    super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
    super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl = (Sprite *)0x0;
    std::__uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>::reset
              ((__uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_> *)this,(pointer)0x0)
    ;
    rVar2 = NO_FILE;
  }
  return rVar2;
}

Assistant:

olc::rcode Renderable::Load(const std::string &sFile, ResourcePack *pack, bool filter)
	{
		pSprite = std::make_unique<olc::Sprite>();
		if (pSprite->LoadFromFile(sFile, pack) == olc::rcode::OK)
		{
			pDecal = std::make_unique<olc::Decal>(pSprite.get(), filter);
			return olc::rcode::OK;
		}
		else
		{
			pSprite.release();
			pSprite = nullptr;
			return olc::rcode::NO_FILE;
		}
	}